

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::InputIntN(char *label,int *v,int components,ImGuiInputTextFlags extra_flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  char *text_end;
  float fVar4;
  int local_40;
  int i;
  bool value_changed;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiInputTextFlags extra_flags_local;
  int components_local;
  int *v_local;
  char *label_local;
  
  pIVar3 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar3->SkipItems & 1U) == 0) {
    label_local._7_1_ = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    for (local_40 = 0; local_40 < components; local_40 = local_40 + 1) {
      PushID(local_40);
      bVar2 = InputInt("##v",v + local_40,0,0,extra_flags);
      label_local._7_1_ = label_local._7_1_ != false || bVar2;
      SameLine(0.0,(pIVar1->Style).ItemInnerSpacing.x);
      PopID();
      PopItemWidth();
    }
    PopID();
    fVar4 = ImMax((pIVar3->DC).CurrentLineTextBaseOffset,(pIVar1->Style).FramePadding.y);
    (pIVar3->DC).CurrentLineTextBaseOffset = fVar4;
    text_end = FindRenderedTextEnd(label,(char *)0x0);
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::InputIntN(const char* label, int* v, int components, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputInt("##v", &v[i], 0, 0, extra_flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.CurrentLineTextBaseOffset, g.Style.FramePadding.y);
    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}